

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *
wasm::HeapTypeGenerator::makeInhabitable
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer *this;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar3;
  bool bVar4;
  undefined4 uVar5;
  Shareability share;
  size_type sVar6;
  undefined8 *puVar7;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *__x;
  Type TVar8;
  Type TVar9;
  long lVar10;
  pointer pHVar11;
  iterator iVar12;
  _Storage<wasm::HeapType,_true> _Var13;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x_00;
  pointer pHVar14;
  byte extraout_DL;
  uint uVar15;
  ulong uVar16;
  value_type *__x_01;
  char *pcVar17;
  size_t i_1;
  pointer pTVar18;
  size_t start;
  ulong uVar19;
  pointer *this_00;
  size_t i;
  FieldPos field;
  FieldPos field_00;
  FieldPos pos;
  FieldPos pos_00;
  FieldPos pos_01;
  FieldPos pos_02;
  Signature signature;
  optional<wasm::HeapType> other;
  optional<wasm::HeapType> other_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_long>,_false,_true>,_bool>
  pVar20;
  undefined1 auVar21 [16];
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar22;
  undefined1 local_290 [8];
  unordered_map<wasm::HeapType,_unsigned_long,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  typeIndices;
  undefined1 local_240 [8];
  Inhabitator inhabitator;
  Type result;
  undefined1 auStack_198 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> deduplicatedIndices;
  HeapType type;
  unsigned_long uStack_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined8 local_138;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_130;
  undefined1 auStack_128 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> deduplicated;
  value_type child;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_e8;
  key_type local_c8;
  HeapType root;
  undefined1 auStack_b8 [8];
  HeapType type_1;
  __node_base _Stack_88;
  value_type local_80;
  HeapType next;
  __node_base local_70;
  TypeBuilder builder;
  value_type type_3;
  HeapType HStack_58;
  vector<wasm::Type,_std::allocator<wasm::Type>_> results;
  
  pHVar14 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pHVar11 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pHVar14 == pHVar11) {
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_290 = (undefined1  [8])&typeIndices._M_h._M_rehash_policy._M_next_resize;
    typeIndices._M_h._M_buckets = (__buckets_ptr)0x1;
    typeIndices._M_h._M_bucket_count = 0;
    typeIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    typeIndices._M_h._M_element_count._0_4_ = 0x3f800000;
    typeIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    typeIndices._M_h._M_rehash_policy._4_4_ = 0;
    typeIndices._M_h._M_rehash_policy._M_next_resize = 0;
    auStack_198 = (undefined1  [8])0x0;
    deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_128 = (undefined1  [8])0x0;
    deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_130 = types;
    for (; pHVar14 != pHVar11; pHVar14 = pHVar14 + 1) {
      deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pHVar14->id;
      if (deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage <
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x7d) {
        local_240 = (undefined1  [8])0xffffffffffffffff;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_198,
                   (unsigned_long *)local_240);
      }
      else {
        inhabitator.types =
             (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             ((long)deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_128 >> 3);
        local_240 = (undefined1  [8])
                    deduplicatedIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        pVar20 = std::
                 _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_long>>
                           ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_290,local_240);
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_128,
                     (value_type *)
                     &deduplicatedIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_198,
                   (value_type_conflict2 *)
                   ((long)pVar20.first.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                   + 0x10));
      }
    }
    if ((long)deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start - (long)auStack_198 !=
        (long)(local_130->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(local_130->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("deduplicatedIndices.size() == types.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                    ,0x3ea,
                    "static std::vector<HeapType> wasm::HeapTypeGenerator::makeInhabitable(const std::vector<HeapType> &)"
                   );
    }
    local_240 = (undefined1  [8])auStack_128;
    inhabitator.types =
         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
         &inhabitator.nullables._M_h._M_rehash_policy._M_next_resize;
    inhabitator.nullables._M_h._M_buckets = (__buckets_ptr)0x1;
    inhabitator.nullables._M_h._M_bucket_count = 0;
    inhabitator.nullables._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    inhabitator.nullables._M_h._M_element_count._0_4_ = 0x3f800000;
    inhabitator.nullables._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    inhabitator.nullables._M_h._M_rehash_policy._4_4_ = 0;
    inhabitator.nullables._M_h._M_rehash_policy._M_next_resize = 0;
    SubTypes::SubTypes((SubTypes *)&inhabitator.nullables._M_h._M_single_bucket,
                       (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240);
    pHVar11 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->_M_impl
              ).super__Vector_impl_data._M_finish;
    for (pHVar14 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                   _M_impl).super__Vector_impl_data._M_start; pHVar14 != pHVar11;
        pHVar14 = pHVar14 + 1) {
      auStack_b8 = (undefined1  [8])pHVar14->id;
      bVar4 = HeapType::isSignature((HeapType *)auStack_b8);
      if (!bVar4) {
        ::wasm::HeapType::getTypeChildren();
        for (uVar19 = 0;
            uVar19 < (ulong)((long)(type.id -
                                   (long)deduplicatedIndices.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage) >> 3);
            uVar19 = uVar19 + 1) {
          deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)deduplicatedIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[uVar19];
          if (((ulong)deduplicated.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 1) == 0 &&
              (pointer)&DAT_00000006 <
              deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            HStack_58 = Type::getHeapType((Type *)&deduplicated.
                                                                                                      
                                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         );
            bVar4 = HeapType::isBottom(&stack0xffffffffffffffa8);
            if ((bVar4) &&
               (((ulong)deduplicated.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 3) == 0 &&
                (pointer)&DAT_00000006 <
                deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)) {
              field._8_8_ = uVar19 & 0xffffffff;
              field.first.id = (uintptr_t)auStack_b8;
              anon_unknown_24::Inhabitator::markNullable((Inhabitator *)local_240,field);
            }
          }
        }
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                   &deduplicatedIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    pHVar11 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->_M_impl
              ).super__Vector_impl_data._M_finish;
    for (pHVar14 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                   _M_impl).super__Vector_impl_data._M_start; pHVar14 != pHVar11;
        pHVar14 = pHVar14 + 1) {
      auStack_b8 = (undefined1  [8])pHVar14->id;
      bVar4 = HeapType::isSignature((HeapType *)auStack_b8);
      if (!bVar4) {
        ::wasm::HeapType::getTypeChildren();
        for (uVar19 = 0;
            uVar19 < (ulong)((long)(type.id -
                                   (long)deduplicatedIndices.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage) >> 3);
            uVar19 = uVar19 + 1) {
          deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)deduplicatedIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[uVar19];
          if (((ulong)deduplicated.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 1) == 0 &&
              (pointer)&DAT_00000006 <
              deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            HStack_58 = Type::getHeapType((Type *)&deduplicated.
                                                                                                      
                                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         );
            bVar4 = HeapType::isMaybeShared(&stack0xffffffffffffffa8,ext);
            if ((bVar4) &&
               (((ulong)deduplicated.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 3) == 0 &&
                (pointer)&DAT_00000006 <
                deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage)) {
              field_00._8_8_ = uVar19 & 0xffffffff;
              field_00.first.id = (uintptr_t)auStack_b8;
              anon_unknown_24::Inhabitator::markNullable((Inhabitator *)local_240,field_00);
            }
          }
        }
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                   &deduplicatedIndices.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
    }
    auStack_b8 = (undefined1  [8])&_Stack_88;
    type_1.id = 1;
    _Stack_88._M_nxt = (_Hash_node_base *)0x0;
    deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &uStack_150;
    uStack_150 = 0;
    local_148 = (undefined1 *)&local_148;
    local_138 = 0;
    pHVar11 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->_M_impl
              ).super__Vector_impl_data._M_finish;
    local_140 = local_148;
    for (pHVar14 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                   _M_impl).super__Vector_impl_data._M_start; pHVar14 != pHVar11;
        pHVar14 = pHVar14 + 1) {
      local_c8.id = pHVar14->id;
      sVar6 = std::
              _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)auStack_b8,&stack0xffffffffffffff38);
      if (sVar6 == 0) {
        ::wasm::HeapType::getTypeChildren();
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8._M_impl.super__Vector_impl_data._M_end_of_storage;
        HStack_58.id = (uintptr_t)local_e8._M_impl.super__Vector_impl_data._M_start;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = local_e8._M_impl.super__Vector_impl_data._M_finish;
        local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_c8.id;
        std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>::pair
                  ((pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int> *)
                   &child,(pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>
                           *)&stack0xffffffffffffffa8);
        InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
        ::insert((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                  *)&deduplicatedIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                 (pair<const_wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                  *)&deduplicated.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&child);
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa8
                  );
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_e8);
      }
    }
    this = &deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
    ::~InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::pair<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_unsigned_int>_>
                         *)this);
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_b8);
    deduplicatedIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &uStack_150;
    uStack_150 = 0;
    uVar19 = 0;
    while( true ) {
      pHVar14 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                _M_impl).super__Vector_impl_data._M_start;
      uVar16 = (long)(((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                     _M_impl).super__Vector_impl_data._M_finish - (long)pHVar14 >> 3;
      if (uVar16 <= uVar19) break;
      auStack_b8 = (undefined1  [8])pHVar14[uVar19].id;
      type_1.id = uVar19;
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_long>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_long>,std::allocator<std::pair<wasm::HeapType_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this,(_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)auStack_b8);
      uVar19 = uVar19 + 1;
    }
    ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_70,uVar16);
    pTVar18 = (pointer)0x0;
    deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    child.id = (uintptr_t)&local_70;
    while( true ) {
      this_00 = &deduplicated.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pHVar14 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                _M_impl).super__Vector_impl_data._M_start;
      pHVar11 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                _M_impl).super__Vector_impl_data._M_finish;
      if ((pointer)((long)pHVar11 - (long)pHVar14 >> 3) <= pTVar18) break;
      _builder = pHVar14[(long)pTVar18].id;
      uVar5 = ::wasm::HeapType::getKind();
      switch(uVar5) {
      case 1:
        auVar21 = ::wasm::HeapType::getSignature();
        root.id = auVar21._8_8_;
        local_c8.id = auVar21._0_8_;
        auStack_b8 = (undefined1  [8])0x0;
        type_1.id = 0;
        HStack_58.id = (uintptr_t)&stack0xffffffffffffff38;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        PVar22 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 Type::end((Type *)HStack_58.id);
        uVar19 = 0;
        uVar16 = 0;
        for (; PVar1.index = (size_t)results.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start,
            PVar1.parent = (Type *)HStack_58.id, PVar22 != PVar1;
            results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)&(results.
                                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->id + 1)) {
          puVar7 = (undefined8 *)
                   ::wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffa8);
          local_80.id = *puVar7;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8,
                     &stack0xffffffffffffff80);
          pos._8_8_ = uVar16 & 0xffffffff;
          pos.first.id = _builder;
          anon_unknown_24::Inhabitator::build::anon_class_24_3_6ccb4b07::operator()
                    ((anon_class_24_3_6ccb4b07 *)
                     &deduplicated.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pos,(Type *)(type_1.id - 8));
          uVar16 = uVar16 + 1;
          uVar19 = (ulong)((int)uVar19 + 1);
        }
        HStack_58.id = 0;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_80.id = (uintptr_t)&root;
        next.id = 0;
        PVar22 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 Type::end((Type *)local_80.id);
        for (; PVar2.index = next.id, PVar2.parent = (Type *)local_80.id, PVar22 != PVar2;
            next.id = next.id + 1) {
          puVar7 = (undefined8 *)
                   ::wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffff80);
          inhabitator.subtypes.typeSubTypes._M_h._M_single_bucket = (__node_base_ptr)*puVar7;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa8,
                     (value_type *)&inhabitator.subtypes.typeSubTypes._M_h._M_single_bucket);
          pos_02._8_8_ = uVar19;
          pos_02.first.id = _builder;
          anon_unknown_24::Inhabitator::build::anon_class_24_3_6ccb4b07::operator()
                    ((anon_class_24_3_6ccb4b07 *)
                     &deduplicated.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pos_02,
                     results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start + -1);
          uVar19 = (ulong)((int)uVar19 + 1);
        }
        TVar8.id = ::wasm::TypeBuilder::getTempTupleType((vector *)&local_70);
        TVar9.id = ::wasm::TypeBuilder::getTempTupleType((vector *)&local_70);
        signature.results.id = TVar9.id;
        signature.params.id = TVar8.id;
        local_80.id = (uintptr_t)&local_70;
        next.id = (uintptr_t)pTVar18;
        TypeBuilder::Entry::operator=((Entry *)&stack0xffffffffffffff80,signature);
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa8
                  );
        std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                  ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_b8);
        break;
      case 2:
        __x = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)::wasm::HeapType::getStruct();
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_b8,__x);
        lVar10 = 0;
        for (uVar19 = 0; uVar19 < (ulong)((long)(type_1.id - (long)auStack_b8) >> 4);
            uVar19 = uVar19 + 1) {
          pos_01._8_8_ = uVar19 & 0xffffffff;
          pos_01.first.id = _builder;
          anon_unknown_24::Inhabitator::build::anon_class_24_3_6ccb4b07::operator()
                    ((anon_class_24_3_6ccb4b07 *)this_00,pos_01,(Type *)((long)auStack_b8 + lVar10))
          ;
          lVar10 = lVar10 + 0x10;
        }
        HStack_58.id = (uintptr_t)&local_70;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = pTVar18;
        TypeBuilder::Entry::operator=((Entry *)&stack0xffffffffffffffa8,(Struct *)auStack_b8);
        std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                  ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_b8);
        break;
      case 3:
        ::wasm::HeapType::getArray();
        pos_00._8_8_ = 0;
        pos_00.first.id = _builder;
        anon_unknown_24::Inhabitator::build::anon_class_24_3_6ccb4b07::operator()
                  ((anon_class_24_3_6ccb4b07 *)this_00,pos_00,(Type *)auStack_b8);
        typeIndices._M_h._M_single_bucket = (__node_base_ptr)auStack_b8;
        HStack_58.id = (uintptr_t)&local_70;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = pTVar18;
        TypeBuilder::Entry::operator=
                  ((Entry *)&stack0xffffffffffffffa8,(Array *)&typeIndices._M_h._M_single_bucket);
        break;
      case 4:
        uVar15 = 0x3b3;
        pcVar17 = "TODO: cont";
        goto LAB_001ac8bb;
      default:
        uVar15 = 0x3b7;
        pcVar17 = "unexpected kind";
LAB_001ac8bb:
        ::wasm::handle_unreachable
                  (pcVar17,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                   ,uVar15);
      }
      pTVar18 = (pointer)((long)&pTVar18->id + 1);
    }
    for (uVar19 = 0; uVar19 < (ulong)((long)pHVar11 - (long)pHVar14 >> 3); uVar19 = uVar19 + lVar10)
    {
      auStack_b8 = (undefined1  [8])::wasm::HeapType::getRecGroup();
      lVar10 = ::wasm::RecGroup::size();
      ::wasm::TypeBuilder::createRecGroup((ulong)&local_70,uVar19);
      pHVar14 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                _M_impl).super__Vector_impl_data._M_start;
      pHVar11 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                _M_impl).super__Vector_impl_data._M_finish;
    }
    for (pTVar18 = (pointer)0x0; pTVar18 < (pointer)((long)pHVar11 - (long)pHVar14 >> 3);
        pTVar18 = (pointer)((long)&pTVar18->id + 1)) {
      auStack_b8 = (undefined1  [8])::wasm::HeapType::getDeclaredSuperType();
      type_1.id._0_1_ = extraout_DL;
      if ((extraout_DL & 1) != 0) {
        iVar12 = std::
                 _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&deduplicatedIndices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)auStack_b8
                       );
        HStack_58.id = (uintptr_t)&local_70;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = pTVar18;
        if (iVar12.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>.
            _M_cur == (__node_type *)0x0) {
          other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          other_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)auStack_b8;
          TypeBuilder::Entry::subTypeOf((Entry *)&stack0xffffffffffffffa8,other_00);
        }
        else {
          root.id = *(uintptr_t *)
                     ((long)iVar12.
                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_long>,_true>
                            ._M_cur + 0x10);
          local_c8.id = (uintptr_t)&local_70;
          _Var13._M_value =
               TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&stack0xffffffffffffff38);
          other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var13;
          TypeBuilder::Entry::subTypeOf((Entry *)&stack0xffffffffffffffa8,other);
        }
      }
      auStack_b8 = (undefined1  [8])&local_70;
      type_1.id = (uintptr_t)pTVar18;
      bVar4 = (bool)::wasm::HeapType::isOpen();
      TypeBuilder::Entry::setOpen((Entry *)auStack_b8,bVar4);
      auStack_b8 = (undefined1  [8])&local_70;
      type_1.id = (uintptr_t)pTVar18;
      share = ::wasm::HeapType::getShared();
      TypeBuilder::Entry::setShared((Entry *)auStack_b8,share);
      pHVar14 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                _M_impl).super__Vector_impl_data._M_start;
      pHVar11 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_240)->
                _M_impl).super__Vector_impl_data._M_finish;
    }
    ::wasm::TypeBuilder::build();
    pvVar3 = local_130;
    __x_00 = std::
             get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                       ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_b8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_e8,__x_00);
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)auStack_b8);
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_70);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&deduplicatedIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_move_assign
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_128,
               (_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_e8);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_e8);
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar10 = 0;
    for (uVar19 = 0;
        pHVar14 = (pvVar3->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                  _M_impl.super__Vector_impl_data._M_start,
        uVar19 < (ulong)((long)(pvVar3->
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pHVar14 >> 3);
        uVar19 = uVar19 + 1) {
      if (*(long *)((long)auStack_198 + lVar10) == -1) {
        if (0x7c < *(ulong *)((long)&pHVar14->id + lVar10)) {
          __assert_fail("types[i].isBasic()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                        ,0x3f7,
                        "static std::vector<HeapType> wasm::HeapTypeGenerator::makeInhabitable(const std::vector<HeapType> &)"
                       );
        }
        __x_01 = (value_type *)((long)&pHVar14->id + lVar10);
      }
      else {
        __x_01 = (value_type *)((long)auStack_128 + *(long *)((long)auStack_198 + lVar10) * 8);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
                (__return_storage_ptr__,__x_01);
      lVar10 = lVar10 + 8;
    }
    anon_unknown_24::Inhabitator::~Inhabitator((Inhabitator *)local_240);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_128);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_198);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_290);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType>
HeapTypeGenerator::makeInhabitable(const std::vector<HeapType>& types) {
  if (types.empty()) {
    return {};
  }

  // Remove duplicate and basic types. We will insert them back at the end.
  std::unordered_map<HeapType, size_t> typeIndices;
  std::vector<size_t> deduplicatedIndices;
  std::vector<HeapType> deduplicated;
  for (auto type : types) {
    if (type.isBasic()) {
      deduplicatedIndices.push_back(-1);
      continue;
    }
    auto [it, inserted] = typeIndices.insert({type, deduplicated.size()});
    if (inserted) {
      deduplicated.push_back(type);
    }
    deduplicatedIndices.push_back(it->second);
  }
  assert(deduplicatedIndices.size() == types.size());

  // Construct the new types.
  Inhabitator inhabitator(deduplicated);
  inhabitator.markBottomRefsNullable();
  inhabitator.markExternRefsNullable();
  inhabitator.breakNonNullableCycles();
  deduplicated = inhabitator.build();

  // Re-duplicate and re-insert basic types as necessary.
  std::vector<HeapType> result;
  for (size_t i = 0; i < types.size(); ++i) {
    if (deduplicatedIndices[i] == (size_t)-1) {
      assert(types[i].isBasic());
      result.push_back(types[i]);
    } else {
      result.push_back(deduplicated[deduplicatedIndices[i]]);
    }
  }
  return result;
}